

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O1

void __thiscall
QWidgetTextControlPrivate::setCursorPosition(QWidgetTextControlPrivate *this,int pos,MoveMode mode)

{
  undefined8 uVar1;
  long in_FS_OFFSET;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::setPosition((int)this + 0x88,pos);
  if (mode != KeepAnchor) {
    QTextCursor::QTextCursor((QTextCursor *)&local_28);
    uVar1 = *(undefined8 *)&this->selectedWordOnDoubleClick;
    *(undefined8 *)&this->selectedWordOnDoubleClick = local_28;
    local_28 = uVar1;
    QTextCursor::~QTextCursor((QTextCursor *)&local_28);
    QTextCursor::QTextCursor((QTextCursor *)&local_28);
    uVar1 = *(undefined8 *)&this->selectedBlockOnTrippleClick;
    *(undefined8 *)&this->selectedBlockOnTrippleClick = local_28;
    local_28 = uVar1;
    QTextCursor::~QTextCursor((QTextCursor *)&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::setCursorPosition(int pos, QTextCursor::MoveMode mode)
{
    cursor.setPosition(pos, mode);

    if (mode != QTextCursor::KeepAnchor) {
        selectedWordOnDoubleClick = QTextCursor();
        selectedBlockOnTrippleClick = QTextCursor();
    }
}